

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::setSelectionArea
          (QGraphicsScene *this,QPainterPath *path,ItemSelectionOperation selectionOperation,
          ItemSelectionMode mode,QTransform *deviceTransform)

{
  bool bVar1;
  Int IVar2;
  QGraphicsScenePrivate *this_00;
  QGraphicsItem **ppQVar3;
  int in_EDX;
  QPainterPath *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item_1;
  add_const_t<QSet<QGraphicsItem_*>_> *__range2;
  QList<QGraphicsItem_*> *__range1;
  bool changed;
  QGraphicsScenePrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  QGraphicsItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QSet<QGraphicsItem_*> unselectItems;
  undefined4 in_stack_ffffffffffffff38;
  GraphicsItemFlag in_stack_ffffffffffffff3c;
  QGraphicsItem *in_stack_ffffffffffffff48;
  QTransform *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  QSet<QGraphicsItem_*> *this_01;
  uint7 in_stack_ffffffffffffff60;
  byte bVar4;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_4c;
  QGraphicsItem *local_48;
  QGraphicsItem **local_40;
  const_iterator local_38;
  const_iterator local_30;
  QSet<QGraphicsItem_*> local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QSet<QGraphicsItem_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsScene *)0x9caf32);
  QPainterPath::operator=(&this_00->selectionArea,in_RSI);
  local_10.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  QSet<QGraphicsItem_*>::QSet
            ((QSet<QGraphicsItem_*> *)in_RDI,
             (QSet<QGraphicsItem_*> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  this_00->selectionChanging = this_00->selectionChanging + 1;
  bVar4 = 0;
  local_28.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::items
            ((QGraphicsScene *)this_00,(QPainterPath *)(ulong)in_stack_ffffffffffffff60,
             (ItemSelectionMode)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (SortOrder)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  this_01 = &local_28;
  local_30.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
  local_38.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
  while( true ) {
    local_40 = local_38.i;
    bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_30,local_38);
    if (!bVar1) break;
    ppQVar3 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_30);
    local_48 = *ppQVar3;
    QGraphicsItem::flags(in_RDI);
    local_4c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                   ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_RDI,in_stack_ffffffffffffff3c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4c);
    if (IVar2 != 0) {
      bVar1 = QGraphicsItem::isSelected(in_stack_ffffffffffffff48);
      if (!bVar1) {
        bVar4 = 1;
      }
      QSet<QGraphicsItem_*>::remove(&local_10,(char *)&local_48);
      QGraphicsItem::setSelected
                ((QGraphicsItem *)CONCAT17(bVar4,in_stack_ffffffffffffff60),
                 SUB81((ulong)this_01 >> 0x38,0));
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_30);
  }
  if (in_EDX == 0) {
    QSet<QGraphicsItem_*>::begin(this_01);
    QSet<QGraphicsItem_*>::end(this_01);
    while (bVar1 = QSet<QGraphicsItem_*>::const_iterator::operator!=
                             ((const_iterator *)in_RDI,
                              (const_iterator *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)), bVar1)
    {
      QSet<QGraphicsItem_*>::const_iterator::operator*((const_iterator *)0x9cb1a0);
      QGraphicsItem::setSelected
                ((QGraphicsItem *)CONCAT17(bVar4,in_stack_ffffffffffffff60),
                 SUB81((ulong)this_01 >> 0x38,0));
      bVar4 = 1;
      QSet<QGraphicsItem_*>::const_iterator::operator++((const_iterator *)in_RDI);
    }
  }
  this_00->selectionChanging = this_00->selectionChanging + -1;
  if ((this_00->selectionChanging == 0) && ((bVar4 & 1) != 0)) {
    selectionChanged((QGraphicsScene *)0x9cb1fc);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9cb209);
  QSet<QGraphicsItem_*>::~QSet((QSet<QGraphicsItem_*> *)0x9cb216);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::setSelectionArea(const QPainterPath &path,
                                      Qt::ItemSelectionOperation selectionOperation,
                                      Qt::ItemSelectionMode mode,
                                      const QTransform &deviceTransform)
{
    Q_D(QGraphicsScene);

    // Note: with boolean path operations, we can improve performance here
    // quite a lot by "growing" the old path instead of replacing it. That
    // allows us to only check the intersect area for changes, instead of
    // reevaluating the whole path over again.
    d->selectionArea = path;

    QSet<QGraphicsItem *> unselectItems = d->selectedItems;

    // Disable emitting selectionChanged() for individual items.
    ++d->selectionChanging;
    bool changed = false;

    // Set all items in path to selected.
    const auto items = this->items(path, mode, Qt::DescendingOrder, deviceTransform);
    for (QGraphicsItem *item : items) {
        if (item->flags() & QGraphicsItem::ItemIsSelectable) {
            if (!item->isSelected())
                changed = true;
            unselectItems.remove(item);
            item->setSelected(true);
        }
    }

    switch (selectionOperation) {
    case Qt::ReplaceSelection:
        // Deselect all items outside path.
        for (QGraphicsItem *item : std::as_const(unselectItems)) {
            item->setSelected(false);
            changed = true;
        }
        break;
    default:
        break;
    }

    // Re-enable emitting selectionChanged() for individual items.
    --d->selectionChanging;

    if (!d->selectionChanging && changed)
        emit selectionChanged();
}